

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

TX_TYPE get_default_tx_type(PLANE_TYPE plane_type,MACROBLOCKD *xd,TX_SIZE tx_size,
                           int use_screen_content_tools)

{
  int iVar1;
  int in_ECX;
  byte in_DL;
  long in_RSI;
  char in_DIL;
  MB_MODE_INFO *mbmi;
  PLANE_TYPE in_stack_ffffffffffffffdf;
  MB_MODE_INFO *mbmi_00;
  TX_TYPE local_1;
  
  mbmi_00 = (MB_MODE_INFO *)**(undefined8 **)(in_RSI + 0x1eb8);
  iVar1 = is_inter_block(mbmi_00);
  if ((((iVar1 == 0) && (in_DIL == '\0')) &&
      (*(int *)(in_RSI + 0x29c4 + (ulong)((byte)*(undefined2 *)&mbmi_00->field_0xa7 & 7) * 4) == 0))
     && ((in_DL < 3 && (in_ECX == 0)))) {
    local_1 = intra_mode_to_tx_type(mbmi_00,in_stack_ffffffffffffffdf);
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

static inline TX_TYPE get_default_tx_type(PLANE_TYPE plane_type,
                                          const MACROBLOCKD *xd,
                                          TX_SIZE tx_size,
                                          int use_screen_content_tools) {
  const MB_MODE_INFO *const mbmi = xd->mi[0];

  if (is_inter_block(mbmi) || plane_type != PLANE_TYPE_Y ||
      xd->lossless[mbmi->segment_id] || tx_size >= TX_32X32 ||
      use_screen_content_tools)
    return DEFAULT_INTER_TX_TYPE;

  return intra_mode_to_tx_type(mbmi, plane_type);
}